

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuCreateVfs(sqlite3rbu *p)

{
  int iVar1;
  sqlite3_vfs *psVar2;
  sqlite3_vfs *pVfs;
  char zRnd [64];
  int rnd;
  sqlite3rbu *p_local;
  
  sqlite3_randomness(4,zRnd + 0x3c);
  sqlite3_snprintf(0x40,(char *)&pVfs,"rbu_vfs_%d",(ulong)(uint)zRnd._60_4_);
  iVar1 = sqlite3rbu_create_vfs((char *)&pVfs,(char *)0x0);
  p->rc = iVar1;
  if (p->rc == 0) {
    psVar2 = sqlite3_vfs_find((char *)&pVfs);
    p->zVfsName = psVar2->zName;
    psVar2[1].pNext = (sqlite3_vfs *)p;
  }
  return;
}

Assistant:

static void rbuCreateVfs(sqlite3rbu *p){
  int rnd;
  char zRnd[64];

  assert( p->rc==SQLITE_OK );
  sqlite3_randomness(sizeof(int), (void*)&rnd);
  sqlite3_snprintf(sizeof(zRnd), zRnd, "rbu_vfs_%d", rnd);
  p->rc = sqlite3rbu_create_vfs(zRnd, 0);
  if( p->rc==SQLITE_OK ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(zRnd);
    assert( pVfs );
    p->zVfsName = pVfs->zName;
    ((rbu_vfs*)pVfs)->pRbu = p;
  }
}